

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O2

void __thiscall
irr::video::COpenGL3DriverBase::loadShaderData
          (COpenGL3DriverBase *this,path *vertexShaderName,path *fragmentShaderName,
          c8 **vertexShaderData,c8 **fragmentShaderData)

{
  IFileSystem *pIVar1;
  c8 **ppcVar2;
  int iVar3;
  undefined4 extraout_var;
  long *plVar5;
  long lVar6;
  c8 *pcVar7;
  char *pcVar8;
  double dVar9;
  allocator<char> local_131;
  c8 **local_130;
  path *local_128;
  path *local_120;
  c8 **local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string warning;
  path fsPath;
  path vsPath;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  long *plVar4;
  undefined4 extraout_var_00;
  
  local_118 = vertexShaderData;
  core::string<char>::string((string<char> *)&vsPath,&this->OGLES2ShaderPath);
  local_128 = vertexShaderName;
  ::std::__cxx11::string::append((string *)&vsPath);
  core::string<char>::string((string<char> *)&fsPath,&this->OGLES2ShaderPath);
  ppcVar2 = local_118;
  local_120 = fragmentShaderName;
  ::std::__cxx11::string::append((string *)&fsPath);
  *ppcVar2 = (c8 *)0x0;
  *fragmentShaderData = (c8 *)0x0;
  pIVar1 = (this->super_CNullDriver).FileSystem;
  local_130 = fragmentShaderData;
  iVar3 = (**pIVar1->_vptr_IFileSystem)(pIVar1,&vsPath);
  plVar4 = (long *)CONCAT44(extraout_var,iVar3);
  if (plVar4 == (long *)0x0) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&warning,
               "Warning: Missing shader files needed to simulate fixed function materials:\n",
               (allocator<char> *)&local_f0);
  }
  else {
    pIVar1 = (this->super_CNullDriver).FileSystem;
    iVar3 = (**pIVar1->_vptr_IFileSystem)(pIVar1,&fsPath);
    plVar5 = (long *)CONCAT44(extraout_var_00,iVar3);
    if (plVar5 != (long *)0x0) {
      lVar6 = (**(code **)(*plVar4 + 0x10))(plVar4);
      if (lVar6 != 0) {
        pcVar7 = (c8 *)operator_new__(lVar6 + 1);
        *ppcVar2 = pcVar7;
        (**(code **)*plVar4)(plVar4,pcVar7,lVar6);
        (*ppcVar2)[lVar6] = '\0';
      }
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,"Loaded ",&local_131);
      std::__cxx11::to_string(&local_70,lVar6);
      ::std::operator+(&local_50,&local_110,&local_70);
      ::std::operator+(&local_f0,&local_50," bytes for vertex shader ");
      ::std::operator+(&warning,&local_f0,(local_128->str)._M_dataplus._M_p);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      dVar9 = (double)::std::__cxx11::string::_M_dispose();
      os::Printer::log((Printer *)warning._M_dataplus._M_p,dVar9);
      ::std::__cxx11::string::_M_dispose();
      lVar6 = (**(code **)(*plVar5 + 0x10))(plVar5);
      if (lVar6 != 0) {
        if (plVar5 == plVar4) {
          (**(code **)(*plVar5 + 8))(plVar5,0,0);
        }
        pcVar7 = (c8 *)operator_new__(lVar6 + 1);
        ppcVar2 = local_130;
        *local_130 = pcVar7;
        (**(code **)*plVar5)(plVar5,pcVar7,lVar6);
        (*ppcVar2)[lVar6] = '\0';
      }
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,"Loaded ",&local_131);
      std::__cxx11::to_string(&local_70,lVar6);
      ::std::operator+(&local_50,&local_110,&local_70);
      ::std::operator+(&local_f0,&local_50," bytes for fragment shader ");
      ::std::operator+(&warning,&local_f0,(local_120->str)._M_dataplus._M_p);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      dVar9 = (double)::std::__cxx11::string::_M_dispose();
      os::Printer::log((Printer *)warning._M_dataplus._M_p,dVar9);
      ::std::__cxx11::string::_M_dispose();
      IReferenceCounted::drop((IReferenceCounted *)(*(long *)(*plVar4 + -0x18) + (long)plVar4));
      IReferenceCounted::drop((IReferenceCounted *)(*(long *)(*plVar5 + -0x18) + (long)plVar5));
      goto LAB_0020c342;
    }
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&warning,
               "Warning: Missing shader files needed to simulate fixed function materials:\n",
               (allocator<char> *)&local_f0);
  }
  pcVar8 = (char *)::std::__cxx11::string::append((char *)&warning);
  ::std::__cxx11::string::append(pcVar8);
  dVar9 = (double)::std::__cxx11::string::append((char *)&warning);
  os::Printer::log((Printer *)warning._M_dataplus._M_p,dVar9);
  ::std::__cxx11::string::_M_dispose();
LAB_0020c342:
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void COpenGL3DriverBase::loadShaderData(const io::path &vertexShaderName, const io::path &fragmentShaderName, c8 **vertexShaderData, c8 **fragmentShaderData)
{
	io::path vsPath(OGLES2ShaderPath);
	vsPath += vertexShaderName;

	io::path fsPath(OGLES2ShaderPath);
	fsPath += fragmentShaderName;

	*vertexShaderData = 0;
	*fragmentShaderData = 0;

	io::IReadFile *vsFile = FileSystem->createAndOpenFile(vsPath);
	if (!vsFile) {
		std::string warning("Warning: Missing shader files needed to simulate fixed function materials:\n");
		warning.append(vsPath.c_str()).append("\n");
		warning += "Shaderpath can be changed in SIrrCreationParamters::OGLES2ShaderPath";
		os::Printer::log(warning.c_str(), ELL_WARNING);
		return;
	}

	io::IReadFile *fsFile = FileSystem->createAndOpenFile(fsPath);
	if (!fsFile) {
		std::string warning("Warning: Missing shader files needed to simulate fixed function materials:\n");
		warning.append(fsPath.c_str()).append("\n");
		warning += "Shaderpath can be changed in SIrrCreationParamters::OGLES2ShaderPath";
		os::Printer::log(warning.c_str(), ELL_WARNING);
		return;
	}

	long size = vsFile->getSize();
	if (size) {
		*vertexShaderData = new c8[size + 1];
		vsFile->read(*vertexShaderData, size);
		(*vertexShaderData)[size] = 0;
	}
	{
		auto tmp = std::string("Loaded ") + std::to_string(size) + " bytes for vertex shader " + vertexShaderName.c_str();
		os::Printer::log(tmp.c_str(), ELL_INFORMATION);
	}

	size = fsFile->getSize();
	if (size) {
		// if both handles are the same we must reset the file
		if (fsFile == vsFile)
			fsFile->seek(0);

		*fragmentShaderData = new c8[size + 1];
		fsFile->read(*fragmentShaderData, size);
		(*fragmentShaderData)[size] = 0;
	}
	{
		auto tmp = std::string("Loaded ") + std::to_string(size) + " bytes for fragment shader " + fragmentShaderName.c_str();
		os::Printer::log(tmp.c_str(), ELL_INFORMATION);
	}

	vsFile->drop();
	fsFile->drop();
}